

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetScaledStepTol(void *kinmem,sunrealtype scsteptol)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x332;
  }
  else {
    if (0.0 <= scsteptol) {
      if ((scsteptol == 0.0) && (!NAN(scsteptol))) {
        scsteptol = pow(*(double *)((long)kinmem + 8),0.6666666666666667);
      }
      *(sunrealtype *)((long)kinmem + 0x28) = scsteptol;
      return 0;
    }
    msgfmt = "scsteptol < 0 illegal.";
    error_code = -2;
    line = 0x33a;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetScaledStepTol",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int KINSetScaledStepTol(void* kinmem, sunrealtype scsteptol)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (scsteptol < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_SCSTEPTOL);
    return (KIN_ILL_INPUT);
  }

  if (scsteptol == ZERO)
  {
    uround                 = kin_mem->kin_uround;
    kin_mem->kin_scsteptol = SUNRpowerR(uround, TWOTHIRDS);
  }
  else { kin_mem->kin_scsteptol = scsteptol; }

  return (KIN_SUCCESS);
}